

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall
ocl::OpenCLKernel::setArg(OpenCLKernel *this,cl_uint arg_index,size_t arg_size,void *arg_value)

{
  runtime_error *this_00;
  cl_int code;
  string local_1c0;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  uint local_2c;
  void *pvStack_28;
  cl_int ciErrNum;
  void *arg_value_local;
  size_t arg_size_local;
  OpenCLKernel *pOStack_10;
  cl_uint arg_index_local;
  OpenCLKernel *this_local;
  
  pvStack_28 = arg_value;
  arg_value_local = (void *)arg_size;
  arg_size_local._4_4_ = arg_index;
  pOStack_10 = this;
  local_2c = clSetKernelArg(this->kernel_,arg_index,arg_size,arg_value);
  if (local_2c != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_150,(string *)&this->kernel_name_);
    to_string<std::__cxx11::string>(&local_130,&local_150);
    std::operator+(&local_110,"clSetKernelArg ",&local_130);
    std::operator+(&local_f0,&local_110,"#");
    to_string<unsigned_int>(&local_180,arg_size_local._4_4_);
    std::operator+(&local_d0,&local_f0,&local_180);
    std::operator+(&local_b0,&local_d0," (");
    to_string<unsigned_long>(&local_1a0,(unsigned_long)arg_value_local);
    std::operator+(&local_90,&local_b0,&local_1a0);
    std::operator+(&local_70,&local_90," bytes) failed: ");
    errorString_abi_cxx11_(&local_1c0,(ocl *)(ulong)local_2c,code);
    std::operator+(&local_50,&local_70,&local_1c0);
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void OpenCLKernel::setArg(cl_uint arg_index, size_t arg_size, const void *arg_value)
{
	cl_int ciErrNum = clSetKernelArg(kernel_, arg_index, arg_size, arg_value);

	if (ciErrNum != CL_SUCCESS)
		throw std::runtime_error("clSetKernelArg " + to_string(kernel_name_) + "#" + to_string(arg_index) + " (" +to_string(arg_size) + " bytes) failed: " + errorString(ciErrNum));
}